

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SessionTestCase.cpp
# Opt level: O2

ExecutionReport *
anon_unknown.dwarf_334836::createT1142ExecutionReport
          (ExecutionReport *__return_storage_ptr__,char *sender,char *target,int seq)

{
  undefined1 *this;
  int iVar1;
  allocator<char> local_456;
  CHAR local_455 [3];
  allocator<char> local_452;
  allocator<char> local_451;
  FieldBase local_450;
  int local_3f4;
  FieldBase local_3f0;
  char *local_398;
  char *local_390;
  NoContraBrokers noContraBrokers;
  PRICE local_310;
  QTY local_308;
  QTY local_300;
  STRING local_2f8;
  STRING local_2d8;
  STRING local_2b8;
  FieldBase local_298;
  FieldBase local_240;
  FieldBase local_1e8;
  FieldBase local_190;
  FieldBase local_138;
  FieldBase local_e0;
  FieldBase local_88;
  
  local_3f4 = seq;
  local_398 = sender;
  local_390 = target;
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2b8,"ID",&local_451);
  FIX::OrderID::OrderID((OrderID *)&noContraBrokers,&local_2b8);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2d8,"ID",&local_452);
  FIX::ExecID::ExecID((ExecID *)&local_450,&local_2d8);
  local_455[2] = 0x30;
  FIX::ExecTransType::ExecTransType((ExecTransType *)&local_3f0,local_455 + 2);
  local_455[1] = 0x30;
  FIX::ExecType::ExecType((ExecType *)&local_298,local_455 + 1);
  local_455[0] = '0';
  FIX::OrdStatus::OrdStatus((OrdStatus *)&local_240,local_455);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"SYMBOL",&local_456);
  FIX::Symbol::Symbol((Symbol *)&local_88,&local_2f8);
  FIX::Side::Side((Side *)&local_e0,"11D");
  local_300 = 100.0;
  FIX::LeavesQty::LeavesQty((LeavesQty *)&local_138,&local_300);
  local_308 = 0.0;
  FIX::CumQty::CumQty((CumQty *)&local_190,&local_308);
  local_310 = 0.0;
  FIX::AvgPx::AvgPx((AvgPx *)&local_1e8,&local_310);
  FIX42::ExecutionReport::ExecutionReport
            (__return_storage_ptr__,(OrderID *)&noContraBrokers,(ExecID *)&local_450,
             (ExecTransType *)&local_3f0,(ExecType *)&local_298,(OrdStatus *)&local_240,
             (Symbol *)&local_88,(Side *)&local_e0,(LeavesQty *)&local_138,(CumQty *)&local_190,
             (AvgPx *)&local_1e8);
  FIX::FieldBase::~FieldBase(&local_1e8);
  FIX::FieldBase::~FieldBase(&local_190);
  FIX::FieldBase::~FieldBase(&local_138);
  FIX::FieldBase::~FieldBase(&local_e0);
  FIX::FieldBase::~FieldBase(&local_88);
  std::__cxx11::string::~string((string *)&local_2f8);
  FIX::FieldBase::~FieldBase(&local_240);
  FIX::FieldBase::~FieldBase(&local_298);
  FIX::FieldBase::~FieldBase(&local_3f0);
  FIX::FieldBase::~FieldBase(&local_450);
  std::__cxx11::string::~string((string *)&local_2d8);
  FIX::FieldBase::~FieldBase((FieldBase *)&noContraBrokers);
  std::__cxx11::string::~string((string *)&local_2b8);
  this = &(__return_storage_ptr__->super_Message).field_0x70;
  fillHeader((Header *)this,local_398,local_390,local_3f4);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_450,"FIXT.1.1",(allocator<char> *)&local_3f0);
  FIX::BeginString::BeginString((BeginString *)&noContraBrokers,(STRING *)&local_450);
  FIX42::Header::set((Header *)this,(BeginString *)&noContraBrokers);
  FIX::FieldBase::~FieldBase((FieldBase *)&noContraBrokers);
  std::__cxx11::string::~string((string *)&local_450);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"FIX.4.2",(allocator<char> *)&local_298);
  FIX::BeginString::BeginString((BeginString *)&local_450,(STRING *)&local_3f0);
  FIX::Message::toApplVerID((ApplVerID *)&noContraBrokers,(BeginString *)&local_450);
  FIX::FieldMap::setField((FieldMap *)this,(FieldBase *)&noContraBrokers,true);
  FIX::FieldBase::~FieldBase((FieldBase *)&noContraBrokers);
  FIX::FieldBase::~FieldBase(&local_450);
  std::__cxx11::string::~string((string *)&local_3f0);
  FIX42::ExecutionReport::NoContraBrokers::NoContraBrokers(&noContraBrokers);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"BROKER",(allocator<char> *)&local_298);
  FIX::ContraBroker::ContraBroker((ContraBroker *)&local_450,(STRING *)&local_3f0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraBroker *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"TRADER",(allocator<char> *)&local_298);
  FIX::ContraTrader::ContraTrader((ContraTrader *)&local_450,(STRING *)&local_3f0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTrader *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  std::__cxx11::string::~string((string *)&local_3f0);
  local_3f0._vptr_FieldBase = (_func_int **)0x4059000000000000;
  FIX::ContraTradeQty::ContraTradeQty((ContraTradeQty *)&local_450,(QTY *)&local_3f0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeQty *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeTime *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,&noContraBrokers.super_Group);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"BROKER2",(allocator<char> *)&local_298);
  FIX::ContraBroker::ContraBroker((ContraBroker *)&local_450,(STRING *)&local_3f0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraBroker *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  std::__cxx11::string::~string((string *)&local_3f0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_3f0,"TRADER2",(allocator<char> *)&local_298);
  FIX::ContraTrader::ContraTrader((ContraTrader *)&local_450,(STRING *)&local_3f0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTrader *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  std::__cxx11::string::~string((string *)&local_3f0);
  local_3f0._vptr_FieldBase = (_func_int **)0x4059000000000000;
  FIX::ContraTradeQty::ContraTradeQty((ContraTradeQty *)&local_450,(QTY *)&local_3f0);
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeQty *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  FIX::ContraTradeTime::now();
  FIX42::ExecutionReport::NoContraBrokers::set(&noContraBrokers,(ContraTradeTime *)&local_450);
  FIX::FieldBase::~FieldBase(&local_450);
  FIX::Message::addGroup((Message *)__return_storage_ptr__,&noContraBrokers.super_Group);
  iVar1 = FIX::Message::bodyLength((Message *)__return_storage_ptr__,8,9,10);
  FIX::BodyLength::BodyLength((BodyLength *)&local_450,iVar1);
  FIX::FieldMap::setField((FieldMap *)this,&local_450,true);
  FIX::FieldBase::~FieldBase(&local_450);
  iVar1 = FIX::Message::checkSum((Message *)__return_storage_ptr__,10);
  FIX::CheckSum::CheckSum((CheckSum *)&local_450,iVar1);
  FIX::FieldMap::setField
            ((FieldMap *)&(__return_storage_ptr__->super_Message).field_0xe0,&local_450,true);
  FIX::FieldBase::~FieldBase(&local_450);
  FIX::FieldMap::~FieldMap((FieldMap *)&noContraBrokers);
  return __return_storage_ptr__;
}

Assistant:

FIX42::ExecutionReport createT1142ExecutionReport(const char *sender, const char *target, int seq) {
  FIX42::ExecutionReport executionReport(
      OrderID("ID"),
      ExecID("ID"),
      ExecTransType('0'),
      ExecType('0'),
      OrdStatus('0'),
      Symbol("SYMBOL"),
      Side(Side_BUY),
      LeavesQty(100),
      CumQty(0),
      AvgPx(0));
  fillHeader(executionReport.getHeader(), sender, target, seq);
  executionReport.getHeader().set(BeginString("FIXT.1.1"));
  executionReport.getHeader().setField(ApplVerID(FIX::Message::toApplVerID(BeginString("FIX.4.2"))));
  FIX42::ExecutionReport::NoContraBrokers noContraBrokers;
  noContraBrokers.set(ContraBroker("BROKER"));
  noContraBrokers.set(ContraTrader("TRADER"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  noContraBrokers.set(ContraBroker("BROKER2"));
  noContraBrokers.set(ContraTrader("TRADER2"));
  noContraBrokers.set(ContraTradeQty(100));
  noContraBrokers.set(ContraTradeTime::now());
  executionReport.addGroup(noContraBrokers);
  executionReport.getHeader().setField(BodyLength(executionReport.bodyLength()));
  executionReport.getTrailer().setField(CheckSum(executionReport.checkSum()));
  return executionReport;
}